

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.hpp
# Opt level: O2

valarray<double> __thiscall
sciplot::linspace<float,float,double>(sciplot *this,float x0,float x1,size_t numintervals)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  double *extraout_RDX;
  double *pdVar3;
  undefined1 auVar4 [16];
  valarray<double> vVar5;
  
  std::valarray<double>::valarray((valarray<double> *)this,numintervals + 1);
  auVar4._8_4_ = (int)(numintervals >> 0x20);
  auVar4._0_8_ = numintervals;
  auVar4._12_4_ = 0x45300000;
  lVar1 = *(long *)(this + 8);
  pdVar3 = extraout_RDX;
  for (uVar2 = 0; numintervals + 1 != uVar2; uVar2 = uVar2 + 1) {
    if ((long)uVar2 < 0) {
      pdVar3 = (double *)(uVar2 >> 1);
    }
    *(double *)(lVar1 + uVar2 * 8) =
         (double)((float)uVar2 * (x1 - x0)) /
         ((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)numintervals) - 4503599627370496.0)) + (double)x0;
  }
  vVar5._M_data = pdVar3;
  vVar5._M_size = (size_t)this;
  return vVar5;
}

Assistant:

auto linspace(T0 x0, T1 x1, std::size_t numintervals) -> std::valarray<U>
{
    std::valarray<U> result(numintervals + 1);
    for(std::size_t i = 0; i <= numintervals; ++i)
        result[i] = x0 + i * (x1 - x0) / static_cast<U>(numintervals);
    return result;
}